

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* Path::split(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *__return_storage_ptr__,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char *__end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Alloc_hider local_50;
  size_type local_48;
  uint local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  if (path->_M_string_length == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,".","");
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".","");
    paVar1 = &(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_70.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->first)._M_dataplus._M_p = local_70._M_dataplus._M_p;
      (__return_storage_ptr__->first).field_2._M_allocated_capacity =
           CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->first)._M_string_length = local_70._M_string_length;
    paVar1 = &(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
    if ((uint *)local_50._M_p == &local_40) {
      paVar1->_M_allocated_capacity = CONCAT44(uStack_3c,local_40);
      *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 8) =
           CONCAT44(uStack_34,uStack_38);
    }
    else {
      (__return_storage_ptr__->second)._M_dataplus._M_p = local_50._M_p;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity = CONCAT44(uStack_3c,local_40);
    }
    (__return_storage_ptr__->second)._M_string_length = local_48;
  }
  else {
    lVar2 = std::__cxx11::string::rfind((char)path,0x2f);
    if (lVar2 == -1) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,".","");
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_70,path);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return __return_storage_ptr__;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)path);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)path);
      paVar1 = &(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
      if ((uint *)local_50._M_p == &local_40) {
        *(uint *)paVar1 = local_40;
        *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 4) = uStack_3c;
        *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = uStack_38;
        *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 0xc) = uStack_34;
      }
      else {
        (__return_storage_ptr__->first)._M_dataplus._M_p = local_50._M_p;
        (__return_storage_ptr__->first).field_2._M_allocated_capacity = CONCAT44(uStack_3c,local_40)
        ;
      }
      (__return_storage_ptr__->first)._M_string_length = local_48;
      local_48 = 0;
      local_40 = local_40 & 0xffffff00;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      local_50._M_p = (pointer)&local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      if ((uint *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,CONCAT44(uStack_3c,local_40) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return __return_storage_ptr__;
      }
    }
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

pair<string, string> split(const string &path)
{
	if (path.empty())
		return make_pair(string("."), string("."));

	auto index = find_last_slash(path);
	if (index == string::npos)
		return make_pair(string("."), path);

	auto base = path.substr(index + 1, string::npos);
	return make_pair(path.substr(0, index), base);
}